

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void av1_set_single_tile_decoding_mode(AV1_COMMON *cm)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool local_30;
  int no_restoration;
  int no_cdef;
  int no_loopfilter;
  CdefInfo *cdef_info;
  RestorationInfo *rst_info;
  loopfilter *lf;
  AV1_COMMON *cm_local;
  
  (cm->tiles).single_tile_decoding = 0;
  if ((cm->tiles).large_scale != 0) {
    bVar1 = true;
    if ((cm->lf).filter_level[0] == 0) {
      bVar1 = (cm->lf).filter_level[1] != 0;
    }
    bVar2 = false;
    if (((cm->cdef_info).cdef_bits == 0) && (bVar2 = false, (cm->cdef_info).cdef_strengths[0] == 0))
    {
      bVar2 = (cm->cdef_info).cdef_uv_strengths[0] == 0;
    }
    bVar3 = false;
    if ((cm->rst_info[0].frame_restoration_type == RESTORE_NONE) &&
       (bVar3 = false, cm->rst_info[1].frame_restoration_type == RESTORE_NONE)) {
      bVar3 = cm->rst_info[2].frame_restoration_type == RESTORE_NONE;
    }
    local_30 = false;
    if (((bool)(bVar1 ^ 1)) && (local_30 = false, bVar2)) {
      local_30 = bVar3;
    }
    (cm->tiles).single_tile_decoding = (uint)local_30;
  }
  return;
}

Assistant:

void av1_set_single_tile_decoding_mode(AV1_COMMON *const cm) {
  cm->tiles.single_tile_decoding = 0;
  if (cm->tiles.large_scale) {
    struct loopfilter *lf = &cm->lf;
    RestorationInfo *const rst_info = cm->rst_info;
    const CdefInfo *const cdef_info = &cm->cdef_info;

    // Figure out single_tile_decoding by loopfilter_level.
    const int no_loopfilter = !(lf->filter_level[0] || lf->filter_level[1]);
    const int no_cdef = cdef_info->cdef_bits == 0 &&
                        cdef_info->cdef_strengths[0] == 0 &&
                        cdef_info->cdef_uv_strengths[0] == 0;
    const int no_restoration =
        rst_info[0].frame_restoration_type == RESTORE_NONE &&
        rst_info[1].frame_restoration_type == RESTORE_NONE &&
        rst_info[2].frame_restoration_type == RESTORE_NONE;
    assert(IMPLIES(cm->features.coded_lossless, no_loopfilter && no_cdef));
    assert(IMPLIES(cm->features.all_lossless, no_restoration));
    cm->tiles.single_tile_decoding = no_loopfilter && no_cdef && no_restoration;
  }
}